

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O1

int ReadJPEG(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  JDIMENSION JVar1;
  int iVar2;
  size_t height;
  uint64_t stride;
  int ok;
  uint8_t *rgb;
  JPEGReadContext ctx;
  jpeg_decompress_struct dinfo;
  my_error_mgr jerr;
  int local_494;
  uint8_t *local_490;
  uint8_t *local_480;
  jpeg_source_mgr local_478;
  uint8_t *puStack_440;
  size_t local_438;
  jpeg_decompress_struct local_430;
  code *local_1a0 [21];
  __jmp_buf_tag local_f8;
  
  local_490 = (uint8_t *)0x0;
  if (pic == (WebPPicture *)0x0 || (data_size == 0 || data == (uint8_t *)0x0)) {
    return 0;
  }
  local_478.term_source = (_func_void_j_decompress_ptr *)0x0;
  local_478.skip_input_data = (_func_void_j_decompress_ptr_long *)0x0;
  local_478.resync_to_restart = (_func_boolean_j_decompress_ptr_int *)0x0;
  local_478.init_source = (_func_void_j_decompress_ptr *)0x0;
  local_478.fill_input_buffer = (_func_boolean_j_decompress_ptr *)0x0;
  local_478.next_input_byte = (JOCTET *)0x0;
  local_478.bytes_in_buffer = 0;
  puStack_440 = data;
  local_438 = data_size;
  memset(&local_430,0,0x290);
  local_430.err = (jpeg_error_mgr *)jpeg_std_error(local_1a0);
  local_1a0[0] = my_error_exit;
  iVar2 = _setjmp(&local_f8);
  if (iVar2 == 0) {
    jpeg_CreateDecompress(&local_430,0x50,0x290);
    local_430.src = &local_478;
    local_478.init_source = ContextInit;
    local_478.fill_input_buffer = ContextFill;
    local_478.skip_input_data = ContextSkip;
    local_478.resync_to_restart = jpeg_resync_to_restart;
    local_478.term_source = ContextTerm;
    local_478.next_input_byte = (JOCTET *)0x0;
    local_478.bytes_in_buffer = 0;
    if (metadata != (Metadata *)0x0) {
      jpeg_save_markers(&local_430,0xe1,0xffff);
      jpeg_save_markers(&local_430,0xe2,0xffff);
    }
    jpeg_read_header(&local_430,1);
    local_430.out_color_space = JCS_RGB;
    local_430.do_fancy_upsampling = 1;
    jpeg_start_decompress(&local_430);
    JVar1 = local_430.output_height;
    if (local_430.output_components == 3) {
      stride = (ulong)local_430.output_width * 3;
      if ((long)(int)stride == stride) {
        height = (size_t)(int)local_430.output_height;
        iVar2 = ImgIoUtilCheckSizeArgumentsOverflow(stride,height);
        if ((iVar2 != 0) &&
           (local_490 = (uint8_t *)malloc(height * stride), local_490 != (uint8_t *)0x0)) {
          local_480 = local_490;
          if (local_430.output_scanline < local_430.output_height) {
            do {
              iVar2 = jpeg_read_scanlines(&local_430,&local_480,1);
              if (iVar2 != 1) goto LAB_00104ddb;
              local_480 = local_480 + stride;
            } while (local_430.output_scanline < local_430.output_height);
          }
          if ((metadata == (Metadata *)0x0) ||
             (iVar2 = ExtractMetadataFromJPEG(&local_430,metadata), iVar2 != 0)) {
            jpeg_finish_decompress(&local_430);
            jpeg_destroy_decompress(&local_430);
            pic->width = local_430.output_width;
            pic->height = JVar1;
            local_494 = WebPPictureImportRGB(pic,local_490,(int)stride);
            if (local_494 == 0) {
              pic->width = 0;
              pic->height = 0;
              MetadataFree(metadata);
            }
            goto LAB_00104ded;
          }
          ReadJPEG_cold_1();
        }
      }
    }
  }
LAB_00104ddb:
  local_494 = 0;
  MetadataFree(metadata);
  jpeg_destroy_decompress(&local_430);
LAB_00104ded:
  free(local_490);
  return local_494;
}

Assistant:

int ReadJPEG(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic, int keep_alpha,
             Metadata* const metadata) {
  volatile int ok = 0;
  int width, height;
  int64_t stride;
  volatile struct jpeg_decompress_struct dinfo;
  struct my_error_mgr jerr;
  uint8_t* volatile rgb = NULL;
  JSAMPROW buffer[1];
  JPEGReadContext ctx;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  (void)keep_alpha;
  memset(&ctx, 0, sizeof(ctx));
  ctx.data = data;
  ctx.data_size = data_size;

  memset((j_decompress_ptr)&dinfo, 0, sizeof(dinfo));   // for setjmp safety
  dinfo.err = jpeg_std_error(&jerr.pub);
  jerr.pub.error_exit = my_error_exit;

  if (setjmp(jerr.setjmp_buffer)) {
 Error:
    MetadataFree(metadata);
    jpeg_destroy_decompress((j_decompress_ptr)&dinfo);
    goto End;
  }

  jpeg_create_decompress((j_decompress_ptr)&dinfo);
  ContextSetup(&dinfo, &ctx);
  if (metadata != NULL) SaveMetadataMarkers((j_decompress_ptr)&dinfo);
  jpeg_read_header((j_decompress_ptr)&dinfo, TRUE);

  dinfo.out_color_space = JCS_RGB;
  dinfo.do_fancy_upsampling = TRUE;

  jpeg_start_decompress((j_decompress_ptr)&dinfo);

  if (dinfo.output_components != 3) {
    goto Error;
  }

  width = dinfo.output_width;
  height = dinfo.output_height;
  stride = (int64_t)dinfo.output_width * dinfo.output_components * sizeof(*rgb);

  if (stride != (int)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, height)) {
    goto Error;
  }

  rgb = (uint8_t*)malloc((size_t)stride * height);
  if (rgb == NULL) {
    goto Error;
  }
  buffer[0] = (JSAMPLE*)rgb;

  while (dinfo.output_scanline < dinfo.output_height) {
    if (jpeg_read_scanlines((j_decompress_ptr)&dinfo, buffer, 1) != 1) {
      goto Error;
    }
    buffer[0] += stride;
  }

  if (metadata != NULL) {
    ok = ExtractMetadataFromJPEG((j_decompress_ptr)&dinfo, metadata);
    if (!ok) {
      fprintf(stderr, "Error extracting JPEG metadata!\n");
      goto Error;
    }
  }

  jpeg_finish_decompress((j_decompress_ptr)&dinfo);
  jpeg_destroy_decompress((j_decompress_ptr)&dinfo);

  // WebP conversion.
  pic->width = width;
  pic->height = height;
  ok = WebPPictureImportRGB(pic, rgb, (int)stride);
  if (!ok) {
    pic->width = 0;   // WebPPictureImportRGB() barely touches 'pic' on failure.
    pic->height = 0;  // Just reset dimensions but keep any 'custom_ptr' etc.
    MetadataFree(metadata);  // In case the caller forgets to free it on error.
  }

 End:
  free(rgb);
  return ok;
}